

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::InvalidError::InvalidError(InvalidError *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  InvalidError *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  ::std::operator+(&local_38,name,": Too many positional arguments with unlimited expected args");
  InvalidError(this,&local_38,InvalidError);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

InvalidError(std::string name)
        : InvalidError(name + ": Too many positional arguments with unlimited expected args", ExitCodes::InvalidError) {
    }